

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

int Acb_NtkFindDivs_rec(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  
  iVar1 = Acb_ObjIsTravIdPrev(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Acb_ObjSetTravIdCur(p,iObj);
    if (iVar1 != 0) {
      return 0;
    }
    iVar1 = Acb_ObjIsCi(p,iObj);
    if (iVar1 != 0) {
      return 0;
    }
    piVar3 = Acb_ObjFanins(p,iObj);
    uVar4 = 1;
    for (lVar5 = 0; lVar5 < *piVar3; lVar5 = lVar5 + 1) {
      uVar2 = Acb_NtkFindDivs_rec(p,piVar3[lVar5 + 1]);
      uVar4 = uVar4 & uVar2;
    }
    if (uVar4 == 0) {
      return 0;
    }
    Acb_ObjSetTravIdPrev(p,iObj);
  }
  return 1;
}

Assistant:

int Acb_NtkFindDivs_rec( Acb_Ntk_t * p, int iObj )
{
    int * pFanin, iFanin, i, Res = 1;
    if ( Acb_ObjIsTravIdPrev(p, iObj) )
        return 1;
    if ( Acb_ObjSetTravIdCur(p, iObj) )  
        return 0;
    if ( Acb_ObjIsCi(p, iObj) )
        return 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
        Res &= Acb_NtkFindDivs_rec( p, iFanin );
    if ( Res ) Acb_ObjSetTravIdPrev( p, iObj );
    return Res;
}